

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O1

void get_target_assign_pos(tgestate_t *state,vischar_t *vischar,route_t *route)

{
  uint8_t uVar1;
  pos8_t *location;
  mappos8_t *doormappos;
  mappos8_t *local_28;
  mappos8_t *local_20;
  
  uVar1 = get_target(state,route,&local_20,(pos8_t **)&local_28);
  if (uVar1 == 0xff) {
    route_ended(state,vischar,route);
    return;
  }
  if (uVar1 == 0x80) {
    vischar->flags = vischar->flags | 0x40;
    local_28 = local_20;
  }
  (vischar->target).u = local_28->u;
  (vischar->target).v = local_28->v;
  return;
}

Assistant:

void get_target_assign_pos(tgestate_t *state,
                           vischar_t  *vischar,
                           route_t    *route)
{
  uint8_t          get_target_result; /* was A */
  const mappos8_t *doormappos;        /* was HL */
  const pos8_t    *location;          /* was HL */

  assert(state != NULL);
  ASSERT_VISCHAR_VALID(vischar);
  assert(route != NULL);
  ASSERT_ROUTE_VALID(*route);

  get_target_result = get_target(state, route, &doormappos, &location);
  if (get_target_result != get_target_ROUTE_ENDS)
  {
    /* "Didn't hit end of list" case. */
    /* Conv: Inlined $CB61/handle_target here since we're the only user. */

    if (get_target_result == get_target_DOOR)
      vischar->flags |= vischar_FLAGS_TARGET_IS_DOOR;

    /* Conv: In the original game HL returns a doorpos or a location to
     * transfer. This version must cope with get_target() returning results in
     * different vars. */
    if (get_target_result == get_target_DOOR)
    {
      vischar->target.u = doormappos->u;
      vischar->target.v = doormappos->v;
    }
    else
    {
      vischar->target.u = location->x;
      vischar->target.v = location->y;
    }
  }
  else
  {
    route_ended(state, vischar, route); /* was fallthrough */
  }
}